

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void print_usage(void)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  puts("\nUsage:");
  lVar2 = 0x17;
  lVar1 = 0x1660f8;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    printf("%-32s\t %s",lVar1 + -0x84,lVar1);
    lVar1 = lVar1 + 0x288;
  }
  return;
}

Assistant:

void print_usage(void)
{
    WORD32 i = 0;
    WORD32 num_entries = sizeof(argument_mapping) / sizeof(argument_t);
    printf("\nUsage:\n");
    while(i < num_entries)
    {
        printf("%-32s\t %s", argument_mapping[i].argument_name,
               argument_mapping[i].description);
        i++;
    }
}